

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_interior_deregister(tsdn_t *tsdn,rtree_ctx_t *rtree_ctx,extent_t *extent)

{
  size_t sVar1;
  extent_t *in_RDX;
  rtree_ctx_t *in_RSI;
  uintptr_t in_RDI;
  size_t i;
  uintptr_t key;
  rtree_ctx_t *rtree_ctx_00;
  rtree_t *rtree;
  rtree_t *tsdn_00;
  
  rtree = (rtree_t *)0x1;
  while( true ) {
    tsdn_00 = rtree;
    sVar1 = extent_size_get(in_RDX);
    if ((rtree_t *)((sVar1 >> 0xc) - 1) <= rtree) break;
    key = in_RDI;
    rtree_ctx_00 = in_RSI;
    extent_base_get(in_RDX);
    rtree_clear((tsdn_t *)tsdn_00,rtree,rtree_ctx_00,key);
    rtree = (rtree_t *)((long)&(tsdn_00->init_lock).field_0.field_0.prof_data.tot_wait_time.ns + 1);
  }
  return;
}

Assistant:

static void
extent_interior_deregister(tsdn_t *tsdn, rtree_ctx_t *rtree_ctx,
    extent_t *extent) {
	size_t i;

	assert(extent_slab_get(extent));

	for (i = 1; i < (extent_size_get(extent) >> LG_PAGE) - 1; i++) {
		rtree_clear(tsdn, &extents_rtree, rtree_ctx,
		    (uintptr_t)extent_base_get(extent) + (uintptr_t)(i <<
		    LG_PAGE));
	}
}